

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall crypto_tests::CryptoTest::TestRIPEMD160(CryptoTest *this,string *in,string *hexout)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  CRIPEMD160 *in_stack_00000018;
  CryptoTest *in_stack_00000020;
  CRIPEMD160 *in_stack_ffffffffffffff18;
  string_view in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CRIPEMD160::CRIPEMD160(in_stack_ffffffffffffff18);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  ParseHex<unsigned_char>(in_stack_ffffffffffffff80);
  TestVector<CRIPEMD160,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestRIPEMD160(const std::string &in, const std::string &hexout) { TestVector(CRIPEMD160(), in, ParseHex(hexout));}